

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::pmin(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  BasicType BVar1;
  int32_t iVar2;
  Literal *local_78;
  Literal local_38;
  Literal *local_20;
  Literal *other_local;
  Literal *this_local;
  
  local_20 = other;
  other_local = this;
  this_local = __return_storage_ptr__;
  BVar1 = wasm::Type::getBasic(&this->type);
  if (BVar1 != f32 && BVar1 != f64) {
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                       ,0x60d);
  }
  lt(&local_38,local_20,this);
  iVar2 = geti32(&local_38);
  local_78 = this;
  if (iVar2 != 0) {
    local_78 = local_20;
  }
  Literal(__return_storage_ptr__,local_78);
  ~Literal(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::pmin(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::f32:
    case Type::f64:
      return other.lt(*this).geti32() ? other : *this;
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}